

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int subjournalPageIfRequired(PgHdr *pPg)

{
  Pager *pPager;
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  sqlite3_file *pJfd;
  uint i;
  long lVar4;
  
  pPager = pPg->pPager;
  i = pPg->pgno;
  uVar3 = (ulong)(uint)pPager->nSavepoint;
  if (pPager->nSavepoint < 1) {
    uVar3 = 0;
  }
  lVar4 = 0;
  while( true ) {
    if (uVar3 * 0x30 - lVar4 == 0) {
      return 0;
    }
    if ((i <= *(uint *)((long)pPager->aSavepoint->aWalData + lVar4 + -8)) &&
       (iVar2 = sqlite3BitvecTestNotNull
                          (*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar4 + -0x10),i),
       iVar2 == 0)) break;
    lVar4 = lVar4 + 0x30;
  }
  if (pPager->journalMode != '\x02') {
    pJfd = pPager->sjfd;
    if (pJfd->pMethods == (sqlite3_io_methods *)0x0) {
      if ((pPager->journalMode == '\x04') ||
         (iVar2 = sqlite3Config.nStmtSpill, pPager->subjInMemory != '\0')) {
        iVar2 = -1;
      }
      iVar2 = sqlite3JournalOpen(pPager->pVfs,(char *)0x0,pJfd,0x201e,iVar2);
      if (iVar2 != 0) {
        return iVar2;
      }
      pJfd = pPager->sjfd;
      i = pPg->pgno;
    }
    pvVar1 = pPg->pData;
    lVar4 = ((long)pPager->pageSize + 4) * (ulong)pPager->nSubRec;
    iVar2 = write32bits(pJfd,lVar4,i);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = (*pPager->sjfd->pMethods->xWrite)(pPager->sjfd,pvVar1,pPager->pageSize,lVar4 + 4);
    if (iVar2 != 0) {
      return iVar2;
    }
    i = pPg->pgno;
  }
  pPager->nSubRec = pPager->nSubRec + 1;
  iVar2 = addToSavepointBitvecs(pPager,i);
  return iVar2;
}

Assistant:

static int subjournalPageIfRequired(PgHdr *pPg){
  if( subjRequiresPage(pPg) ){
    return subjournalPage(pPg);
  }else{
    return SQLITE_OK;
  }
}